

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O2

void __thiscall
SGParser::Parse<SGParser::Generator::RegExprDFAParseElement>::Destroy
          (Parse<SGParser::Generator::RegExprDFAParseElement> *this)

{
  RegExprDFAParseElement *pRVar1;
  size_t *psVar2;
  
  CleanupParseStack(this,0);
  pRVar1 = this->pStack;
  this->pStack = (RegExprDFAParseElement *)0x0;
  if (pRVar1 != (RegExprDFAParseElement *)0x0) {
    operator_delete__(pRVar1);
  }
  psVar2 = this->pValidTokenStackPositions;
  this->pValidTokenStackPositions = (size_t *)0x0;
  if (psVar2 != (size_t *)0x0) {
    operator_delete__(psVar2);
  }
  this->TopState = 0xffffffff;
  return;
}

Assistant:

void Parse<StackElement>::Destroy() {
    // Delete the parse stack
    CleanupParseStack();

    delete[] std::exchange(pStack, nullptr);
    delete[] std::exchange(pValidTokenStackPositions, nullptr);

    TopState = InvalidState;
}